

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-queue.h
# Opt level: O0

void __thiscall
kj::ProducerConsumerQueue<unsigned_long>::push
          (ProducerConsumerQueue<unsigned_long> *this,unsigned_long v)

{
  bool bVar1;
  unsigned_long *puVar2;
  unsigned_long local_18;
  unsigned_long v_local;
  ProducerConsumerQueue<unsigned_long> *this_local;
  
  local_18 = v;
  v_local = (unsigned_long)this;
  bVar1 = WaiterQueue<unsigned_long>::empty(&this->waiters);
  if (bVar1) {
    puVar2 = mv<unsigned_long>(&local_18);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
              (&this->values,puVar2);
  }
  else {
    bVar1 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->values);
    if (!bVar1) {
      kj::_::inlineRequireFailure
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-queue.h"
                 ,0x79,"values.empty()","",(char *)0x0);
    }
    puVar2 = mv<unsigned_long>(&local_18);
    WaiterQueue<unsigned_long>::fulfill(&this->waiters,puVar2);
  }
  return;
}

Assistant:

void push(T v) {
    // Push an existing value onto the queue.

    if (!waiters.empty()) {
      // We have at least one waiter, give the value to the oldest.
      KJ_IASSERT(values.empty());

      // Fulfill the first waiter and return without store our value.
      waiters.fulfill(kj::mv(v));
    } else {
      // We don't have any waiters, store the value.
      values.push_front(kj::mv(v));
    }
  }